

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O1

Cbs_Man_t * Cbs_ManAlloc(Gia_Man_t *pGia)

{
  Cbs_Man_t *pCVar1;
  Gia_Obj_t **ppGVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  
  pCVar1 = (Cbs_Man_t *)calloc(1,0xe0);
  (pCVar1->pClauses).nSize = 10000;
  (pCVar1->pJust).nSize = 10000;
  (pCVar1->pProp).nSize = 10000;
  ppGVar2 = (Gia_Obj_t **)malloc(80000);
  (pCVar1->pProp).pData = ppGVar2;
  ppGVar2 = (Gia_Obj_t **)malloc(80000);
  (pCVar1->pJust).pData = ppGVar2;
  ppGVar2 = (Gia_Obj_t **)malloc(80000);
  (pCVar1->pClauses).pData = ppGVar2;
  (pCVar1->pClauses).iHead = 1;
  (pCVar1->pClauses).iTail = 1;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar3->pArray = piVar4;
  pCVar1->vModel = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(4000);
  pVVar3->pArray = piVar4;
  pCVar1->vLevReas = pVVar3;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  pCVar1->vTemp = pVVar5;
  pCVar1->pAig = pGia;
  (pCVar1->Pars).nBTLimit = 0;
  (pCVar1->Pars).nJustLimit = 0;
  (pCVar1->Pars).nBTThis = 0;
  (pCVar1->Pars).nBTThisNc = 0;
  (pCVar1->Pars).nJustThis = 0;
  (pCVar1->Pars).nBTTotal = 0;
  (pCVar1->Pars).nJustTotal = 0;
  (pCVar1->Pars).fUseHighest = 0;
  (pCVar1->Pars).fUseHighest = 0;
  (pCVar1->Pars).fUseLowest = 0;
  (pCVar1->Pars).fUseMaxFF = 0;
  (pCVar1->Pars).fVerbose = 0;
  (pCVar1->Pars).nBTLimit = 1000;
  (pCVar1->Pars).nJustLimit = 100;
  (pCVar1->Pars).fUseHighest = 1;
  (pCVar1->Pars).fUseLowest = 0;
  (pCVar1->Pars).fUseMaxFF = 0;
  (pCVar1->Pars).fVerbose = 1;
  return pCVar1;
}

Assistant:

Cbs_Man_t * Cbs_ManAlloc( Gia_Man_t * pGia )
{
    Cbs_Man_t * p;
    p = ABC_CALLOC( Cbs_Man_t, 1 );
    p->pProp.nSize = p->pJust.nSize = p->pClauses.nSize = 10000;
    p->pProp.pData = ABC_ALLOC( Gia_Obj_t *, p->pProp.nSize );
    p->pJust.pData = ABC_ALLOC( Gia_Obj_t *, p->pJust.nSize );
    p->pClauses.pData = ABC_ALLOC( Gia_Obj_t *, p->pClauses.nSize );
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->vModel   = Vec_IntAlloc( 1000 );
    p->vLevReas = Vec_IntAlloc( 1000 );
    p->vTemp    = Vec_PtrAlloc( 1000 );
    p->pAig     = pGia;
    Cbs_SetDefaultParams( &p->Pars );
    return p;
}